

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  parasail_result_t *ppVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i *palVar19;
  __m128i *palVar20;
  char cVar21;
  char cVar22;
  int iVar23;
  int iVar24;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *palVar25;
  int32_t in_R9D;
  byte bVar26;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  undefined1 auVar27 [16];
  byte bVar44;
  undefined1 auVar28 [16];
  ulong uVar37;
  __m128i vH_00;
  __m128i alVar45;
  ulong in_stack_fffffffffffff9f8;
  long local_5f8;
  long local_5f0;
  ulong uStack_5d8;
  __m128i vH_1;
  int8_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_4eb;
  int8_t score;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_478;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  char local_328;
  char cStack_327;
  char cStack_326;
  char cStack_325;
  char cStack_324;
  char cStack_323;
  char cStack_322;
  char cStack_321;
  char cStack_320;
  char cStack_31f;
  char cStack_31e;
  char cStack_31d;
  char cStack_31c;
  char cStack_31b;
  char cStack_31a;
  char cStack_319;
  char local_318;
  char cStack_317;
  char cStack_316;
  char cStack_315;
  char cStack_314;
  char cStack_313;
  char cStack_312;
  char cStack_311;
  char cStack_310;
  char cStack_30f;
  char cStack_30e;
  char cStack_30d;
  char cStack_30c;
  char cStack_30b;
  char cStack_30a;
  char cStack_309;
  char local_2f8;
  char cStack_2f7;
  char cStack_2f6;
  char cStack_2f5;
  char cStack_2f4;
  char cStack_2f3;
  char cStack_2f2;
  char cStack_2f1;
  char cStack_2f0;
  char cStack_2ef;
  char cStack_2ee;
  char cStack_2ed;
  char cStack_2ec;
  char cStack_2eb;
  char cStack_2ea;
  char cStack_2e9;
  char local_2e8;
  char cStack_2e7;
  char cStack_2e6;
  char cStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  char cStack_2e1;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  char cStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  char cStack_2d9;
  char local_2d8;
  char cStack_2d7;
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  char cStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  char cStack_2c9;
  char local_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char local_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  char local_278;
  char cStack_277;
  char cStack_276;
  char cStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  char cStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  char cStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  char cStack_269;
  char local_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char local_118;
  char cStack_117;
  char cStack_116;
  char cStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  char cStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  char cStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  char cStack_109;
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  undefined1 local_30 [24];
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_striped_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_striped_profile_sse41_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_striped_profile_sse41_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_478 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar23 = (iVar1 + 0xf) / 0x10;
    pvVar3 = (profile->profile8).score;
    i._0_1_ = (char)open;
    local_70._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    local_78._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    uVar4 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_78._0_3_)))));
    uVar7 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_70._0_3_)))));
    j._0_1_ = (undefined1)gap;
    local_50._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    local_58._0_3_ = CONCAT21(CONCAT11((undefined1)j,(undefined1)j),(undefined1)j);
    uVar5 = CONCAT17((undefined1)j,
                     CONCAT16((undefined1)j,
                              CONCAT15((undefined1)j,
                                       CONCAT14((undefined1)j,CONCAT13((undefined1)j,local_58._0_3_)
                                               ))));
    uVar8 = CONCAT17((undefined1)j,
                     CONCAT16((undefined1)j,
                              CONCAT15((undefined1)j,
                                       CONCAT14((undefined1)j,CONCAT13((undefined1)j,local_50._0_3_)
                                               ))));
    if (ppVar2->min <= -open) {
      i._0_1_ = -(char)ppVar2->min;
    }
    cVar21 = (char)i + -0x7f;
    cVar22 = ((byte)ppVar2->max ^ 0x7f) - 1;
    local_30._0_3_ = CONCAT21(CONCAT11(cVar21,cVar21),cVar21);
    local_38._0_3_ = CONCAT21(CONCAT11(cVar21,cVar21),cVar21);
    ppVar6 = (parasail_result_t *)
             CONCAT17(cVar21,CONCAT16(cVar21,CONCAT15(cVar21,CONCAT14(cVar21,CONCAT13(cVar21,
                                                  local_38._0_3_)))));
    lVar9 = CONCAT17(cVar21,CONCAT16(cVar21,CONCAT15(cVar21,CONCAT14(cVar21,CONCAT13(cVar21,local_30
                                                  ._0_3_)))));
    local_10._0_3_ = CONCAT21(CONCAT11(cVar22,cVar22),cVar22);
    local_18._0_3_ = CONCAT21(CONCAT11(cVar22,cVar22),cVar22);
    vSaturationCheckMax[1] =
         CONCAT17(cVar22,CONCAT16(cVar22,CONCAT15(cVar22,CONCAT14(cVar22,CONCAT13(cVar22,local_18.
                                                  _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar22,CONCAT16(cVar22,CONCAT15(cVar22,CONCAT14(cVar22,CONCAT13(cVar22,local_10.
                                                  _0_3_)))));
    result = ppVar6;
    vSaturationCheckMax[0] = lVar9;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar23 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100801;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar23);
      pvE = parasail_memalign___m128i(0x10,(long)iVar23);
      ptr = parasail_memalign___m128i(0x10,(long)iVar23);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar23; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_5f8 = (long)(-(gap * (h.m[1]._0_4_ * iVar23 + k)) - open);
            local_5f0 = local_5f8;
            if (local_5f8 < -0x80) {
              local_5f0 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_5f0;
            local_5f8 = local_5f8 - open;
            if (local_5f8 < -0x80) {
              local_5f8 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_5f8;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar24 = -(gap * (k + -1)) - open;
          if (iVar24 < -0x80) {
            iVar24 = -0x80;
          }
          ptr_00[k] = (int8_t)iVar24;
        }
        for (s1Len = 0; palVar20 = pvHLoad, palVar19 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar9;
          vH[1] = (longlong)ppVar6;
          palVar25 = pvHLoad + (iVar23 + -1);
          uVar37 = (*palVar25)[0];
          iVar24 = ppVar2->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar19;
          vH[0] = (*palVar25)[1] << 8 | uVar37 >> 0x38;
          vP = (__m128i *)(uVar37 << 8 | (ulong)(byte)ptr_00[s1Len]);
          for (k = 0; k < iVar23; k = k + 1) {
            auVar27 = paddsb((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar24 * iVar23) * 0x10));
            palVar25 = ptr + k;
            lVar10 = (*palVar25)[0];
            lVar11 = (*palVar25)[1];
            alVar45 = *palVar25;
            local_278 = auVar27[0];
            cStack_277 = auVar27[1];
            cStack_276 = auVar27[2];
            cStack_275 = auVar27[3];
            cStack_274 = auVar27[4];
            cStack_273 = auVar27[5];
            cStack_272 = auVar27[6];
            cStack_271 = auVar27[7];
            cStack_270 = auVar27[8];
            cStack_26f = auVar27[9];
            cStack_26e = auVar27[10];
            cStack_26d = auVar27[0xb];
            cStack_26c = auVar27[0xc];
            cStack_26b = auVar27[0xd];
            cStack_26a = auVar27[0xe];
            cStack_269 = auVar27[0xf];
            local_288 = (char)lVar10;
            cStack_287 = (char)((ulong)lVar10 >> 8);
            cStack_286 = (char)((ulong)lVar10 >> 0x10);
            cStack_285 = (char)((ulong)lVar10 >> 0x18);
            cStack_284 = (char)((ulong)lVar10 >> 0x20);
            cStack_283 = (char)((ulong)lVar10 >> 0x28);
            cStack_282 = (char)((ulong)lVar10 >> 0x30);
            cStack_281 = (char)((ulong)lVar10 >> 0x38);
            cStack_280 = (char)lVar11;
            cStack_27f = (char)((ulong)lVar11 >> 8);
            cStack_27e = (char)((ulong)lVar11 >> 0x10);
            cStack_27d = (char)((ulong)lVar11 >> 0x18);
            cStack_27c = (char)((ulong)lVar11 >> 0x20);
            cStack_27b = (char)((ulong)lVar11 >> 0x28);
            cStack_27a = (char)((ulong)lVar11 >> 0x30);
            cStack_279 = (char)((ulong)lVar11 >> 0x38);
            bVar26 = (local_278 < local_288) * local_288 | (local_278 >= local_288) * local_278;
            bVar29 = (cStack_277 < cStack_287) * cStack_287 |
                     (cStack_277 >= cStack_287) * cStack_277;
            bVar30 = (cStack_276 < cStack_286) * cStack_286 |
                     (cStack_276 >= cStack_286) * cStack_276;
            bVar31 = (cStack_275 < cStack_285) * cStack_285 |
                     (cStack_275 >= cStack_285) * cStack_275;
            bVar32 = (cStack_274 < cStack_284) * cStack_284 |
                     (cStack_274 >= cStack_284) * cStack_274;
            bVar33 = (cStack_273 < cStack_283) * cStack_283 |
                     (cStack_273 >= cStack_283) * cStack_273;
            bVar34 = (cStack_272 < cStack_282) * cStack_282 |
                     (cStack_272 >= cStack_282) * cStack_272;
            bVar35 = (cStack_271 < cStack_281) * cStack_281 |
                     (cStack_271 >= cStack_281) * cStack_271;
            bVar36 = (cStack_270 < cStack_280) * cStack_280 |
                     (cStack_270 >= cStack_280) * cStack_270;
            bVar38 = (cStack_26f < cStack_27f) * cStack_27f |
                     (cStack_26f >= cStack_27f) * cStack_26f;
            bVar39 = (cStack_26e < cStack_27e) * cStack_27e |
                     (cStack_26e >= cStack_27e) * cStack_26e;
            bVar40 = (cStack_26d < cStack_27d) * cStack_27d |
                     (cStack_26d >= cStack_27d) * cStack_26d;
            bVar41 = (cStack_26c < cStack_27c) * cStack_27c |
                     (cStack_26c >= cStack_27c) * cStack_26c;
            bVar42 = (cStack_26b < cStack_27b) * cStack_27b |
                     (cStack_26b >= cStack_27b) * cStack_26b;
            bVar43 = (cStack_26a < cStack_27a) * cStack_27a |
                     (cStack_26a >= cStack_27a) * cStack_26a;
            bVar44 = (cStack_269 < cStack_279) * cStack_279 |
                     (cStack_269 >= cStack_279) * cStack_269;
            local_2a8 = (char)vH[1];
            cStack_2a7 = vH[1]._1_1_;
            cStack_2a6 = vH[1]._2_1_;
            cStack_2a5 = vH[1]._3_1_;
            cStack_2a4 = vH[1]._4_1_;
            cStack_2a3 = vH[1]._5_1_;
            cStack_2a2 = vH[1]._6_1_;
            cStack_2a1 = vH[1]._7_1_;
            cStack_2a0 = (char)vH[2];
            cStack_29f = vH[2]._1_1_;
            cStack_29e = vH[2]._2_1_;
            cStack_29d = vH[2]._3_1_;
            cStack_29c = vH[2]._4_1_;
            cStack_29b = vH[2]._5_1_;
            cStack_29a = vH[2]._6_1_;
            cStack_299 = vH[2]._7_1_;
            bVar26 = ((char)bVar26 < local_2a8) * local_2a8 | ((char)bVar26 >= local_2a8) * bVar26;
            bVar29 = ((char)bVar29 < cStack_2a7) * cStack_2a7 |
                     ((char)bVar29 >= cStack_2a7) * bVar29;
            bVar30 = ((char)bVar30 < cStack_2a6) * cStack_2a6 |
                     ((char)bVar30 >= cStack_2a6) * bVar30;
            bVar31 = ((char)bVar31 < cStack_2a5) * cStack_2a5 |
                     ((char)bVar31 >= cStack_2a5) * bVar31;
            bVar32 = ((char)bVar32 < cStack_2a4) * cStack_2a4 |
                     ((char)bVar32 >= cStack_2a4) * bVar32;
            bVar33 = ((char)bVar33 < cStack_2a3) * cStack_2a3 |
                     ((char)bVar33 >= cStack_2a3) * bVar33;
            bVar34 = ((char)bVar34 < cStack_2a2) * cStack_2a2 |
                     ((char)bVar34 >= cStack_2a2) * bVar34;
            bVar35 = ((char)bVar35 < cStack_2a1) * cStack_2a1 |
                     ((char)bVar35 >= cStack_2a1) * bVar35;
            bVar36 = ((char)bVar36 < cStack_2a0) * cStack_2a0 |
                     ((char)bVar36 >= cStack_2a0) * bVar36;
            bVar38 = ((char)bVar38 < cStack_29f) * cStack_29f |
                     ((char)bVar38 >= cStack_29f) * bVar38;
            bVar39 = ((char)bVar39 < cStack_29e) * cStack_29e |
                     ((char)bVar39 >= cStack_29e) * bVar39;
            bVar40 = ((char)bVar40 < cStack_29d) * cStack_29d |
                     ((char)bVar40 >= cStack_29d) * bVar40;
            bVar41 = ((char)bVar41 < cStack_29c) * cStack_29c |
                     ((char)bVar41 >= cStack_29c) * bVar41;
            bVar42 = ((char)bVar42 < cStack_29b) * cStack_29b |
                     ((char)bVar42 >= cStack_29b) * bVar42;
            bVar43 = ((char)bVar43 < cStack_29a) * cStack_29a |
                     ((char)bVar43 >= cStack_29a) * bVar43;
            bVar44 = ((char)bVar44 < cStack_299) * cStack_299 |
                     ((char)bVar44 >= cStack_299) * bVar44;
            vP._0_2_ = CONCAT11(bVar29,bVar26);
            vP._0_3_ = CONCAT12(bVar30,vP._0_2_);
            vP._0_4_ = CONCAT13(bVar31,vP._0_3_);
            vP._0_5_ = CONCAT14(bVar32,vP._0_4_);
            vP._0_6_ = CONCAT15(bVar33,vP._0_5_);
            vP._0_7_ = CONCAT16(bVar34,vP._0_6_);
            vP = (__m128i *)CONCAT17(bVar35,vP._0_7_);
            vH[0]._0_1_ = bVar36;
            vH[0]._1_1_ = bVar38;
            vH[0]._2_1_ = bVar39;
            vH[0]._3_1_ = bVar40;
            vH[0]._4_1_ = bVar41;
            vH[0]._5_1_ = bVar42;
            vH[0]._6_1_ = bVar43;
            vH[0]._7_1_ = bVar44;
            palVar19[k][0] = (longlong)vP;
            palVar19[k][1] = vH[0];
            local_2b8 = (char)result;
            cStack_2b7 = (char)((ulong)result >> 8);
            cStack_2b6 = (char)((ulong)result >> 0x10);
            cStack_2b5 = (char)((ulong)result >> 0x18);
            cStack_2b4 = (char)((ulong)result >> 0x20);
            cStack_2b3 = (char)((ulong)result >> 0x28);
            cStack_2b2 = (char)((ulong)result >> 0x30);
            cStack_2b1 = (char)((ulong)result >> 0x38);
            cStack_2b0 = (char)vSaturationCheckMax[0];
            cStack_2af = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_2ae = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_2ad = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_2ac = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_2ab = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_2aa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_2a9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            result._0_2_ = CONCAT11((cStack_2b7 < (char)bVar29) * bVar29 |
                                    (cStack_2b7 >= (char)bVar29) * cStack_2b7,
                                    (local_2b8 < (char)bVar26) * bVar26 |
                                    (local_2b8 >= (char)bVar26) * local_2b8);
            result._0_3_ = CONCAT12((cStack_2b6 < (char)bVar30) * bVar30 |
                                    (cStack_2b6 >= (char)bVar30) * cStack_2b6,result._0_2_);
            result._0_4_ = CONCAT13((cStack_2b5 < (char)bVar31) * bVar31 |
                                    (cStack_2b5 >= (char)bVar31) * cStack_2b5,result._0_3_);
            result._0_5_ = CONCAT14((cStack_2b4 < (char)bVar32) * bVar32 |
                                    (cStack_2b4 >= (char)bVar32) * cStack_2b4,result._0_4_);
            result._0_6_ = CONCAT15((cStack_2b3 < (char)bVar33) * bVar33 |
                                    (cStack_2b3 >= (char)bVar33) * cStack_2b3,result._0_5_);
            result._0_7_ = CONCAT16((cStack_2b2 < (char)bVar34) * bVar34 |
                                    (cStack_2b2 >= (char)bVar34) * cStack_2b2,result._0_6_);
            result = (parasail_result_t *)
                     CONCAT17((cStack_2b1 < (char)bVar35) * bVar35 |
                              (cStack_2b1 >= (char)bVar35) * cStack_2b1,result._0_7_);
            vSaturationCheckMax[0]._0_2_ =
                 CONCAT11((cStack_2af < (char)bVar38) * bVar38 |
                          (cStack_2af >= (char)bVar38) * cStack_2af,
                          (cStack_2b0 < (char)bVar36) * bVar36 |
                          (cStack_2b0 >= (char)bVar36) * cStack_2b0);
            vSaturationCheckMax[0]._0_3_ =
                 CONCAT12((cStack_2ae < (char)bVar39) * bVar39 |
                          (cStack_2ae >= (char)bVar39) * cStack_2ae,
                          (undefined2)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT13((cStack_2ad < (char)bVar40) * bVar40 |
                          (cStack_2ad >= (char)bVar40) * cStack_2ad,
                          (undefined3)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_5_ =
                 CONCAT14((cStack_2ac < (char)bVar41) * bVar41 |
                          (cStack_2ac >= (char)bVar41) * cStack_2ac,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT15((cStack_2ab < (char)bVar42) * bVar42 |
                          (cStack_2ab >= (char)bVar42) * cStack_2ab,
                          (undefined5)vSaturationCheckMax[0]);
            vSaturationCheckMax[0]._0_7_ =
                 CONCAT16((cStack_2aa < (char)bVar43) * bVar43 |
                          (cStack_2aa >= (char)bVar43) * cStack_2aa,
                          (undefined6)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT17((cStack_2a9 < (char)bVar44) * bVar44 |
                          (cStack_2a9 >= (char)bVar44) * cStack_2a9,
                          (undefined7)vSaturationCheckMax[0]);
            local_1f8 = (char)vSaturationCheckMax[1];
            cStack_1f7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_1f6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_1f5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_1f4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_1f3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_1f2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_1f1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_1f0 = (char)vSaturationCheckMin[0];
            cStack_1ef = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_1ee = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_1ed = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_1ec = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_1eb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_1ea = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_1e9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            bVar26 = ((char)bVar26 < local_1f8) * bVar26 | ((char)bVar26 >= local_1f8) * local_1f8;
            bVar29 = ((char)bVar29 < cStack_1f7) * bVar29 |
                     ((char)bVar29 >= cStack_1f7) * cStack_1f7;
            bVar30 = ((char)bVar30 < cStack_1f6) * bVar30 |
                     ((char)bVar30 >= cStack_1f6) * cStack_1f6;
            bVar31 = ((char)bVar31 < cStack_1f5) * bVar31 |
                     ((char)bVar31 >= cStack_1f5) * cStack_1f5;
            bVar32 = ((char)bVar32 < cStack_1f4) * bVar32 |
                     ((char)bVar32 >= cStack_1f4) * cStack_1f4;
            bVar33 = ((char)bVar33 < cStack_1f3) * bVar33 |
                     ((char)bVar33 >= cStack_1f3) * cStack_1f3;
            bVar34 = ((char)bVar34 < cStack_1f2) * bVar34 |
                     ((char)bVar34 >= cStack_1f2) * cStack_1f2;
            bVar35 = ((char)bVar35 < cStack_1f1) * bVar35 |
                     ((char)bVar35 >= cStack_1f1) * cStack_1f1;
            bVar36 = ((char)bVar36 < cStack_1f0) * bVar36 |
                     ((char)bVar36 >= cStack_1f0) * cStack_1f0;
            bVar38 = ((char)bVar38 < cStack_1ef) * bVar38 |
                     ((char)bVar38 >= cStack_1ef) * cStack_1ef;
            bVar39 = ((char)bVar39 < cStack_1ee) * bVar39 |
                     ((char)bVar39 >= cStack_1ee) * cStack_1ee;
            bVar40 = ((char)bVar40 < cStack_1ed) * bVar40 |
                     ((char)bVar40 >= cStack_1ed) * cStack_1ed;
            bVar41 = ((char)bVar41 < cStack_1ec) * bVar41 |
                     ((char)bVar41 >= cStack_1ec) * cStack_1ec;
            bVar42 = ((char)bVar42 < cStack_1eb) * bVar42 |
                     ((char)bVar42 >= cStack_1eb) * cStack_1eb;
            bVar43 = ((char)bVar43 < cStack_1ea) * bVar43 |
                     ((char)bVar43 >= cStack_1ea) * cStack_1ea;
            bVar44 = ((char)bVar44 < cStack_1e9) * bVar44 |
                     ((char)bVar44 >= cStack_1e9) * cStack_1e9;
            bVar26 = (local_288 < (char)bVar26) * local_288 | (local_288 >= (char)bVar26) * bVar26;
            bVar29 = (cStack_287 < (char)bVar29) * cStack_287 |
                     (cStack_287 >= (char)bVar29) * bVar29;
            bVar30 = (cStack_286 < (char)bVar30) * cStack_286 |
                     (cStack_286 >= (char)bVar30) * bVar30;
            bVar31 = (cStack_285 < (char)bVar31) * cStack_285 |
                     (cStack_285 >= (char)bVar31) * bVar31;
            bVar32 = (cStack_284 < (char)bVar32) * cStack_284 |
                     (cStack_284 >= (char)bVar32) * bVar32;
            bVar33 = (cStack_283 < (char)bVar33) * cStack_283 |
                     (cStack_283 >= (char)bVar33) * bVar33;
            bVar34 = (cStack_282 < (char)bVar34) * cStack_282 |
                     (cStack_282 >= (char)bVar34) * bVar34;
            bVar35 = (cStack_281 < (char)bVar35) * cStack_281 |
                     (cStack_281 >= (char)bVar35) * bVar35;
            bVar36 = (cStack_280 < (char)bVar36) * cStack_280 |
                     (cStack_280 >= (char)bVar36) * bVar36;
            bVar38 = (cStack_27f < (char)bVar38) * cStack_27f |
                     (cStack_27f >= (char)bVar38) * bVar38;
            bVar39 = (cStack_27e < (char)bVar39) * cStack_27e |
                     (cStack_27e >= (char)bVar39) * bVar39;
            bVar40 = (cStack_27d < (char)bVar40) * cStack_27d |
                     (cStack_27d >= (char)bVar40) * bVar40;
            bVar41 = (cStack_27c < (char)bVar41) * cStack_27c |
                     (cStack_27c >= (char)bVar41) * bVar41;
            bVar42 = (cStack_27b < (char)bVar42) * cStack_27b |
                     (cStack_27b >= (char)bVar42) * bVar42;
            bVar43 = (cStack_27a < (char)bVar43) * cStack_27a |
                     (cStack_27a >= (char)bVar43) * bVar43;
            bVar44 = (cStack_279 < (char)bVar44) * cStack_279 |
                     (cStack_279 >= (char)bVar44) * bVar44;
            vSaturationCheckMax[1]._0_2_ =
                 CONCAT11((cStack_2a7 < (char)bVar29) * cStack_2a7 |
                          (cStack_2a7 >= (char)bVar29) * bVar29,
                          (local_2a8 < (char)bVar26) * local_2a8 |
                          (local_2a8 >= (char)bVar26) * bVar26);
            vSaturationCheckMax[1]._0_3_ =
                 CONCAT12((cStack_2a6 < (char)bVar30) * cStack_2a6 |
                          (cStack_2a6 >= (char)bVar30) * bVar30,(undefined2)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT13((cStack_2a5 < (char)bVar31) * cStack_2a5 |
                          (cStack_2a5 >= (char)bVar31) * bVar31,(undefined3)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_5_ =
                 CONCAT14((cStack_2a4 < (char)bVar32) * cStack_2a4 |
                          (cStack_2a4 >= (char)bVar32) * bVar32,(undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT15((cStack_2a3 < (char)bVar33) * cStack_2a3 |
                          (cStack_2a3 >= (char)bVar33) * bVar33,(undefined5)vSaturationCheckMax[1]);
            vSaturationCheckMax[1]._0_7_ =
                 CONCAT16((cStack_2a2 < (char)bVar34) * cStack_2a2 |
                          (cStack_2a2 >= (char)bVar34) * bVar34,(undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT17((cStack_2a1 < (char)bVar35) * cStack_2a1 |
                          (cStack_2a1 >= (char)bVar35) * bVar35,(undefined7)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_2_ =
                 CONCAT11((cStack_29f < (char)bVar38) * cStack_29f |
                          (cStack_29f >= (char)bVar38) * bVar38,
                          (cStack_2a0 < (char)bVar36) * cStack_2a0 |
                          (cStack_2a0 >= (char)bVar36) * bVar36);
            vSaturationCheckMin[0]._0_3_ =
                 CONCAT12((cStack_29e < (char)bVar39) * cStack_29e |
                          (cStack_29e >= (char)bVar39) * bVar39,(undefined2)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT13((cStack_29d < (char)bVar40) * cStack_29d |
                          (cStack_29d >= (char)bVar40) * bVar40,(undefined3)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_5_ =
                 CONCAT14((cStack_29c < (char)bVar41) * cStack_29c |
                          (cStack_29c >= (char)bVar41) * bVar41,(undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT15((cStack_29b < (char)bVar42) * cStack_29b |
                          (cStack_29b >= (char)bVar42) * bVar42,(undefined5)vSaturationCheckMin[0]);
            vSaturationCheckMin[0]._0_7_ =
                 CONCAT16((cStack_29a < (char)bVar43) * cStack_29a |
                          (cStack_29a >= (char)bVar43) * bVar43,(undefined6)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT17((cStack_299 < (char)bVar44) * cStack_299 |
                          (cStack_299 >= (char)bVar44) * bVar44,(undefined7)vSaturationCheckMin[0]);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar23;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,vH_00,s1Len,s2Len,in_R9D,
                            (int32_t)in_stack_fffffffffffff9f8);
            auVar16._8_8_ = vH[0];
            auVar16._0_8_ = vP;
            auVar15._8_8_ = uVar7;
            auVar15._0_8_ = uVar4;
            auVar27 = psubsb(auVar16,auVar15);
            auVar28._8_8_ = uVar8;
            auVar28._0_8_ = uVar5;
            auVar28 = psubsb((undefined1  [16])alVar45,auVar28);
            local_2d8 = auVar28[0];
            cStack_2d7 = auVar28[1];
            cStack_2d6 = auVar28[2];
            cStack_2d5 = auVar28[3];
            cStack_2d4 = auVar28[4];
            cStack_2d3 = auVar28[5];
            cStack_2d2 = auVar28[6];
            cStack_2d1 = auVar28[7];
            cStack_2d0 = auVar28[8];
            cStack_2cf = auVar28[9];
            cStack_2ce = auVar28[10];
            cStack_2cd = auVar28[0xb];
            cStack_2cc = auVar28[0xc];
            cStack_2cb = auVar28[0xd];
            cStack_2ca = auVar28[0xe];
            cStack_2c9 = auVar28[0xf];
            local_2e8 = auVar27[0];
            cStack_2e7 = auVar27[1];
            cStack_2e6 = auVar27[2];
            cStack_2e5 = auVar27[3];
            cStack_2e4 = auVar27[4];
            cStack_2e3 = auVar27[5];
            cStack_2e2 = auVar27[6];
            cStack_2e1 = auVar27[7];
            cStack_2e0 = auVar27[8];
            cStack_2df = auVar27[9];
            cStack_2de = auVar27[10];
            cStack_2dd = auVar27[0xb];
            cStack_2dc = auVar27[0xc];
            cStack_2db = auVar27[0xd];
            cStack_2da = auVar27[0xe];
            cStack_2d9 = auVar27[0xf];
            vF[1] = CONCAT17((cStack_2d1 < cStack_2e1) * cStack_2e1 |
                             (cStack_2d1 >= cStack_2e1) * cStack_2d1,
                             CONCAT16((cStack_2d2 < cStack_2e2) * cStack_2e2 |
                                      (cStack_2d2 >= cStack_2e2) * cStack_2d2,
                                      CONCAT15((cStack_2d3 < cStack_2e3) * cStack_2e3 |
                                               (cStack_2d3 >= cStack_2e3) * cStack_2d3,
                                               CONCAT14((cStack_2d4 < cStack_2e4) * cStack_2e4 |
                                                        (cStack_2d4 >= cStack_2e4) * cStack_2d4,
                                                        CONCAT13((cStack_2d5 < cStack_2e5) *
                                                                 cStack_2e5 |
                                                                 (cStack_2d5 >= cStack_2e5) *
                                                                 cStack_2d5,
                                                                 CONCAT12((cStack_2d6 < cStack_2e6)
                                                                          * cStack_2e6 |
                                                                          (cStack_2d6 >= cStack_2e6)
                                                                          * cStack_2d6,
                                                                          CONCAT11((cStack_2d7 <
                                                                                   cStack_2e7) *
                                                                                   cStack_2e7 |
                                                                                   (cStack_2d7 >=
                                                                                   cStack_2e7) *
                                                                                   cStack_2d7,
                                                                                   (local_2d8 <
                                                                                   local_2e8) *
                                                                                   local_2e8 |
                                                                                   (local_2d8 >=
                                                                                   local_2e8) *
                                                                                   local_2d8)))))));
            vE[0]._0_1_ = (cStack_2d0 < cStack_2e0) * cStack_2e0 |
                          (cStack_2d0 >= cStack_2e0) * cStack_2d0;
            vE[0]._1_1_ = (cStack_2cf < cStack_2df) * cStack_2df |
                          (cStack_2cf >= cStack_2df) * cStack_2cf;
            vE[0]._2_1_ = (cStack_2ce < cStack_2de) * cStack_2de |
                          (cStack_2ce >= cStack_2de) * cStack_2ce;
            vE[0]._3_1_ = (cStack_2cd < cStack_2dd) * cStack_2dd |
                          (cStack_2cd >= cStack_2dd) * cStack_2cd;
            vE[0]._4_1_ = (cStack_2cc < cStack_2dc) * cStack_2dc |
                          (cStack_2cc >= cStack_2dc) * cStack_2cc;
            vE[0]._5_1_ = (cStack_2cb < cStack_2db) * cStack_2db |
                          (cStack_2cb >= cStack_2db) * cStack_2cb;
            vE[0]._6_1_ = (cStack_2ca < cStack_2da) * cStack_2da |
                          (cStack_2ca >= cStack_2da) * cStack_2ca;
            vE[0]._7_1_ = (cStack_2c9 < cStack_2d9) * cStack_2d9 |
                          (cStack_2c9 >= cStack_2d9) * cStack_2c9;
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            auVar27._8_8_ = uVar8;
            auVar27._0_8_ = uVar5;
            auVar27 = psubsb(stack0xfffffffffffffa68,auVar27);
            local_2f8 = auVar27[0];
            cStack_2f7 = auVar27[1];
            cStack_2f6 = auVar27[2];
            cStack_2f5 = auVar27[3];
            cStack_2f4 = auVar27[4];
            cStack_2f3 = auVar27[5];
            cStack_2f2 = auVar27[6];
            cStack_2f1 = auVar27[7];
            cStack_2f0 = auVar27[8];
            cStack_2ef = auVar27[9];
            cStack_2ee = auVar27[10];
            cStack_2ed = auVar27[0xb];
            cStack_2ec = auVar27[0xc];
            cStack_2eb = auVar27[0xd];
            cStack_2ea = auVar27[0xe];
            cStack_2e9 = auVar27[0xf];
            vH[1] = CONCAT17((cStack_2f1 < cStack_2e1) * cStack_2e1 |
                             (cStack_2f1 >= cStack_2e1) * cStack_2f1,
                             CONCAT16((cStack_2f2 < cStack_2e2) * cStack_2e2 |
                                      (cStack_2f2 >= cStack_2e2) * cStack_2f2,
                                      CONCAT15((cStack_2f3 < cStack_2e3) * cStack_2e3 |
                                               (cStack_2f3 >= cStack_2e3) * cStack_2f3,
                                               CONCAT14((cStack_2f4 < cStack_2e4) * cStack_2e4 |
                                                        (cStack_2f4 >= cStack_2e4) * cStack_2f4,
                                                        CONCAT13((cStack_2f5 < cStack_2e5) *
                                                                 cStack_2e5 |
                                                                 (cStack_2f5 >= cStack_2e5) *
                                                                 cStack_2f5,
                                                                 CONCAT12((cStack_2f6 < cStack_2e6)
                                                                          * cStack_2e6 |
                                                                          (cStack_2f6 >= cStack_2e6)
                                                                          * cStack_2f6,
                                                                          CONCAT11((cStack_2f7 <
                                                                                   cStack_2e7) *
                                                                                   cStack_2e7 |
                                                                                   (cStack_2f7 >=
                                                                                   cStack_2e7) *
                                                                                   cStack_2f7,
                                                                                   (local_2f8 <
                                                                                   local_2e8) *
                                                                                   local_2e8 |
                                                                                   (local_2f8 >=
                                                                                   local_2e8) *
                                                                                   local_2f8)))))));
            vF[0]._0_1_ = (cStack_2f0 < cStack_2e0) * cStack_2e0 |
                          (cStack_2f0 >= cStack_2e0) * cStack_2f0;
            vF[0]._1_1_ = (cStack_2ef < cStack_2df) * cStack_2df |
                          (cStack_2ef >= cStack_2df) * cStack_2ef;
            vF[0]._2_1_ = (cStack_2ee < cStack_2de) * cStack_2de |
                          (cStack_2ee >= cStack_2de) * cStack_2ee;
            vF[0]._3_1_ = (cStack_2ed < cStack_2dd) * cStack_2dd |
                          (cStack_2ed >= cStack_2dd) * cStack_2ed;
            vF[0]._4_1_ = (cStack_2ec < cStack_2dc) * cStack_2dc |
                          (cStack_2ec >= cStack_2dc) * cStack_2ec;
            vF[0]._5_1_ = (cStack_2eb < cStack_2db) * cStack_2db |
                          (cStack_2eb >= cStack_2db) * cStack_2eb;
            vF[0]._6_1_ = (cStack_2ea < cStack_2da) * cStack_2da |
                          (cStack_2ea >= cStack_2da) * cStack_2ea;
            vF[0]._7_1_ = (cStack_2e9 < cStack_2d9) * cStack_2d9 |
                          (cStack_2e9 >= cStack_2d9) * cStack_2e9;
            _vP = palVar20[k];
          }
          for (end_query = 0; end_query < 0x10; end_query = end_query + 1) {
            in_stack_fffffffffffff9f8 = (ulong)(ptr_00[s1Len + 1] - open);
            if ((long)in_stack_fffffffffffff9f8 < -0x80) {
              in_stack_fffffffffffff9f8 = 0xffffffffffffff80;
            }
            vF[0] = vF[0] << 8 | (ulong)vH[1] >> 0x38;
            vH[1] = vH[1] << 8 | in_stack_fffffffffffff9f8 & 0xff;
            for (k = 0; k < iVar23; k = k + 1) {
              lVar10 = palVar19[k][0];
              lVar11 = palVar19[k][1];
              local_318 = (char)lVar10;
              cStack_317 = (char)((ulong)lVar10 >> 8);
              cStack_316 = (char)((ulong)lVar10 >> 0x10);
              cStack_315 = (char)((ulong)lVar10 >> 0x18);
              cStack_314 = (char)((ulong)lVar10 >> 0x20);
              cStack_313 = (char)((ulong)lVar10 >> 0x28);
              cStack_312 = (char)((ulong)lVar10 >> 0x30);
              cStack_311 = (char)((ulong)lVar10 >> 0x38);
              cStack_310 = (char)lVar11;
              cStack_30f = (char)((ulong)lVar11 >> 8);
              cStack_30e = (char)((ulong)lVar11 >> 0x10);
              cStack_30d = (char)((ulong)lVar11 >> 0x18);
              cStack_30c = (char)((ulong)lVar11 >> 0x20);
              cStack_30b = (char)((ulong)lVar11 >> 0x28);
              cStack_30a = (char)((ulong)lVar11 >> 0x30);
              cStack_309 = (char)((ulong)lVar11 >> 0x38);
              local_328 = (char)vH[1];
              cStack_327 = vH[1]._1_1_;
              cStack_326 = vH[1]._2_1_;
              cStack_325 = vH[1]._3_1_;
              cStack_324 = vH[1]._4_1_;
              cStack_323 = vH[1]._5_1_;
              cStack_322 = vH[1]._6_1_;
              cStack_321 = vH[1]._7_1_;
              cStack_320 = (char)vH[2];
              cStack_31f = vH[2]._1_1_;
              cStack_31e = vH[2]._2_1_;
              cStack_31d = vH[2]._3_1_;
              cStack_31c = vH[2]._4_1_;
              cStack_31b = vH[2]._5_1_;
              cStack_31a = vH[2]._6_1_;
              cStack_319 = vH[2]._7_1_;
              bVar26 = (local_318 < local_328) * local_328 | (local_318 >= local_328) * local_318;
              bVar29 = (cStack_317 < cStack_327) * cStack_327 |
                       (cStack_317 >= cStack_327) * cStack_317;
              bVar30 = (cStack_316 < cStack_326) * cStack_326 |
                       (cStack_316 >= cStack_326) * cStack_316;
              bVar31 = (cStack_315 < cStack_325) * cStack_325 |
                       (cStack_315 >= cStack_325) * cStack_315;
              bVar32 = (cStack_314 < cStack_324) * cStack_324 |
                       (cStack_314 >= cStack_324) * cStack_314;
              bVar33 = (cStack_313 < cStack_323) * cStack_323 |
                       (cStack_313 >= cStack_323) * cStack_313;
              bVar34 = (cStack_312 < cStack_322) * cStack_322 |
                       (cStack_312 >= cStack_322) * cStack_312;
              bVar35 = (cStack_311 < cStack_321) * cStack_321 |
                       (cStack_311 >= cStack_321) * cStack_311;
              bVar36 = (cStack_310 < cStack_320) * cStack_320 |
                       (cStack_310 >= cStack_320) * cStack_310;
              bVar38 = (cStack_30f < cStack_31f) * cStack_31f |
                       (cStack_30f >= cStack_31f) * cStack_30f;
              bVar39 = (cStack_30e < cStack_31e) * cStack_31e |
                       (cStack_30e >= cStack_31e) * cStack_30e;
              bVar40 = (cStack_30d < cStack_31d) * cStack_31d |
                       (cStack_30d >= cStack_31d) * cStack_30d;
              bVar41 = (cStack_30c < cStack_31c) * cStack_31c |
                       (cStack_30c >= cStack_31c) * cStack_30c;
              bVar42 = (cStack_30b < cStack_31b) * cStack_31b |
                       (cStack_30b >= cStack_31b) * cStack_30b;
              bVar43 = (cStack_30a < cStack_31a) * cStack_31a |
                       (cStack_30a >= cStack_31a) * cStack_30a;
              bVar44 = (cStack_309 < cStack_319) * cStack_319 |
                       (cStack_309 >= cStack_319) * cStack_309;
              vP._0_2_ = CONCAT11(bVar29,bVar26);
              vP._0_3_ = CONCAT12(bVar30,vP._0_2_);
              vP._0_4_ = CONCAT13(bVar31,vP._0_3_);
              vP._0_5_ = CONCAT14(bVar32,vP._0_4_);
              vP._0_6_ = CONCAT15(bVar33,vP._0_5_);
              vP._0_7_ = CONCAT16(bVar34,vP._0_6_);
              vP = (__m128i *)CONCAT17(bVar35,vP._0_7_);
              vH[0]._0_1_ = bVar36;
              vH[0]._1_1_ = bVar38;
              vH[0]._2_1_ = bVar39;
              vH[0]._3_1_ = bVar40;
              vH[0]._4_1_ = bVar41;
              vH[0]._5_1_ = bVar42;
              vH[0]._6_1_ = bVar43;
              vH[0]._7_1_ = bVar44;
              palVar19[k][0] = (longlong)vP;
              palVar19[k][1] = vH[0];
              local_258 = (char)vSaturationCheckMax[1];
              cStack_257 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_256 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_255 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_254 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_253 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_252 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_251 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_250 = (char)vSaturationCheckMin[0];
              cStack_24f = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_24e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_24d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_24c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_24b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_24a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_249 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              vSaturationCheckMax[1]._0_2_ =
                   CONCAT11(((char)bVar29 < cStack_257) * bVar29 |
                            ((char)bVar29 >= cStack_257) * cStack_257,
                            ((char)bVar26 < local_258) * bVar26 |
                            ((char)bVar26 >= local_258) * local_258);
              vSaturationCheckMax[1]._0_3_ =
                   CONCAT12(((char)bVar30 < cStack_256) * bVar30 |
                            ((char)bVar30 >= cStack_256) * cStack_256,
                            (undefined2)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT13(((char)bVar31 < cStack_255) * bVar31 |
                            ((char)bVar31 >= cStack_255) * cStack_255,
                            (undefined3)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_5_ =
                   CONCAT14(((char)bVar32 < cStack_254) * bVar32 |
                            ((char)bVar32 >= cStack_254) * cStack_254,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT15(((char)bVar33 < cStack_253) * bVar33 |
                            ((char)bVar33 >= cStack_253) * cStack_253,
                            (undefined5)vSaturationCheckMax[1]);
              vSaturationCheckMax[1]._0_7_ =
                   CONCAT16(((char)bVar34 < cStack_252) * bVar34 |
                            ((char)bVar34 >= cStack_252) * cStack_252,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT17(((char)bVar35 < cStack_251) * bVar35 |
                            ((char)bVar35 >= cStack_251) * cStack_251,
                            (undefined7)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_2_ =
                   CONCAT11(((char)bVar38 < cStack_24f) * bVar38 |
                            ((char)bVar38 >= cStack_24f) * cStack_24f,
                            ((char)bVar36 < cStack_250) * bVar36 |
                            ((char)bVar36 >= cStack_250) * cStack_250);
              vSaturationCheckMin[0]._0_3_ =
                   CONCAT12(((char)bVar39 < cStack_24e) * bVar39 |
                            ((char)bVar39 >= cStack_24e) * cStack_24e,
                            (undefined2)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT13(((char)bVar40 < cStack_24d) * bVar40 |
                            ((char)bVar40 >= cStack_24d) * cStack_24d,
                            (undefined3)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_5_ =
                   CONCAT14(((char)bVar41 < cStack_24c) * bVar41 |
                            ((char)bVar41 >= cStack_24c) * cStack_24c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT15(((char)bVar42 < cStack_24b) * bVar42 |
                            ((char)bVar42 >= cStack_24b) * cStack_24b,
                            (undefined5)vSaturationCheckMin[0]);
              vSaturationCheckMin[0]._0_7_ =
                   CONCAT16(((char)bVar43 < cStack_24a) * bVar43 |
                            ((char)bVar43 >= cStack_24a) * cStack_24a,
                            (undefined6)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT17(((char)bVar44 < cStack_249) * bVar44 |
                            ((char)bVar44 >= cStack_249) * cStack_249,
                            (undefined7)vSaturationCheckMin[0]);
              local_338 = (char)result;
              cStack_337 = (char)((ulong)result >> 8);
              cStack_336 = (char)((ulong)result >> 0x10);
              cStack_335 = (char)((ulong)result >> 0x18);
              cStack_334 = (char)((ulong)result >> 0x20);
              cStack_333 = (char)((ulong)result >> 0x28);
              cStack_332 = (char)((ulong)result >> 0x30);
              cStack_331 = (char)((ulong)result >> 0x38);
              cStack_330 = (char)vSaturationCheckMax[0];
              cStack_32f = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_32e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_32d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_32c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_32b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_32a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_329 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              result._0_2_ = CONCAT11((cStack_337 < (char)bVar29) * bVar29 |
                                      (cStack_337 >= (char)bVar29) * cStack_337,
                                      (local_338 < (char)bVar26) * bVar26 |
                                      (local_338 >= (char)bVar26) * local_338);
              result._0_3_ = CONCAT12((cStack_336 < (char)bVar30) * bVar30 |
                                      (cStack_336 >= (char)bVar30) * cStack_336,result._0_2_);
              result._0_4_ = CONCAT13((cStack_335 < (char)bVar31) * bVar31 |
                                      (cStack_335 >= (char)bVar31) * cStack_335,result._0_3_);
              result._0_5_ = CONCAT14((cStack_334 < (char)bVar32) * bVar32 |
                                      (cStack_334 >= (char)bVar32) * cStack_334,result._0_4_);
              result._0_6_ = CONCAT15((cStack_333 < (char)bVar33) * bVar33 |
                                      (cStack_333 >= (char)bVar33) * cStack_333,result._0_5_);
              result._0_7_ = CONCAT16((cStack_332 < (char)bVar34) * bVar34 |
                                      (cStack_332 >= (char)bVar34) * cStack_332,result._0_6_);
              result = (parasail_result_t *)
                       CONCAT17((cStack_331 < (char)bVar35) * bVar35 |
                                (cStack_331 >= (char)bVar35) * cStack_331,result._0_7_);
              vSaturationCheckMax[0]._0_2_ =
                   CONCAT11((cStack_32f < (char)bVar38) * bVar38 |
                            (cStack_32f >= (char)bVar38) * cStack_32f,
                            (cStack_330 < (char)bVar36) * bVar36 |
                            (cStack_330 >= (char)bVar36) * cStack_330);
              vSaturationCheckMax[0]._0_3_ =
                   CONCAT12((cStack_32e < (char)bVar39) * bVar39 |
                            (cStack_32e >= (char)bVar39) * cStack_32e,
                            (undefined2)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT13((cStack_32d < (char)bVar40) * bVar40 |
                            (cStack_32d >= (char)bVar40) * cStack_32d,
                            (undefined3)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_5_ =
                   CONCAT14((cStack_32c < (char)bVar41) * bVar41 |
                            (cStack_32c >= (char)bVar41) * cStack_32c,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT15((cStack_32b < (char)bVar42) * bVar42 |
                            (cStack_32b >= (char)bVar42) * cStack_32b,
                            (undefined5)vSaturationCheckMax[0]);
              vSaturationCheckMax[0]._0_7_ =
                   CONCAT16((cStack_32a < (char)bVar43) * bVar43 |
                            (cStack_32a >= (char)bVar43) * cStack_32a,
                            (undefined6)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT17((cStack_329 < (char)bVar44) * bVar44 |
                            (cStack_329 >= (char)bVar44) * cStack_329,
                            (undefined7)vSaturationCheckMax[0]);
              alVar45[0] = (ulong)(uint)k;
              alVar45[1]._0_4_ = iVar23;
              alVar45[1]._4_4_ = 0;
              arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                              rowcols->score_row,alVar45,s1Len,s2Len,in_R9D,
                              (int32_t)in_stack_fffffffffffff9f8);
              auVar14._8_8_ = vH[0];
              auVar14._0_8_ = vP;
              auVar13._8_8_ = uVar7;
              auVar13._0_8_ = uVar4;
              auVar27 = psubsb(auVar14,auVar13);
              auVar12._8_8_ = uVar8;
              auVar12._0_8_ = uVar5;
              register0x00001200 = psubsb(stack0xfffffffffffffa68,auVar12);
              local_f8 = (char)vH[1];
              cStack_f7 = vH[1]._1_1_;
              cStack_f6 = vH[1]._2_1_;
              cStack_f5 = vH[1]._3_1_;
              cStack_f4 = vH[1]._4_1_;
              cStack_f3 = vH[1]._5_1_;
              cStack_f2 = vH[1]._6_1_;
              cStack_f1 = vH[1]._7_1_;
              cStack_f0 = (char)vH[2];
              cStack_ef = vH[2]._1_1_;
              cStack_ee = vH[2]._2_1_;
              cStack_ed = vH[2]._3_1_;
              cStack_ec = vH[2]._4_1_;
              cStack_eb = vH[2]._5_1_;
              cStack_ea = vH[2]._6_1_;
              cStack_e9 = vH[2]._7_1_;
              local_108 = auVar27[0];
              cStack_107 = auVar27[1];
              cStack_106 = auVar27[2];
              cStack_105 = auVar27[3];
              cStack_104 = auVar27[4];
              cStack_103 = auVar27[5];
              cStack_102 = auVar27[6];
              cStack_101 = auVar27[7];
              cStack_100 = auVar27[8];
              cStack_ff = auVar27[9];
              cStack_fe = auVar27[10];
              cStack_fd = auVar27[0xb];
              cStack_fc = auVar27[0xc];
              cStack_fb = auVar27[0xd];
              cStack_fa = auVar27[0xe];
              cStack_f9 = auVar27[0xf];
              auVar18[1] = -(cStack_107 < cStack_f7);
              auVar18[0] = -(local_108 < local_f8);
              auVar18[2] = -(cStack_106 < cStack_f6);
              auVar18[3] = -(cStack_105 < cStack_f5);
              auVar18[4] = -(cStack_104 < cStack_f4);
              auVar18[5] = -(cStack_103 < cStack_f3);
              auVar18[6] = -(cStack_102 < cStack_f2);
              auVar18[7] = -(cStack_101 < cStack_f1);
              auVar18[8] = -(cStack_100 < cStack_f0);
              auVar18[9] = -(cStack_ff < cStack_ef);
              auVar18[10] = -(cStack_fe < cStack_ee);
              auVar18[0xb] = -(cStack_fd < cStack_ed);
              auVar18[0xc] = -(cStack_fc < cStack_ec);
              auVar18[0xd] = -(cStack_fb < cStack_eb);
              auVar18[0xe] = -(cStack_fa < cStack_ea);
              auVar18[0xf] = -(cStack_f9 < cStack_e9);
              if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar18 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar18 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar18 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar18 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar18 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar18 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar18 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar18 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar18 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar18 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar18 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar18 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  cStack_f9 >= cStack_e9) goto LAB_0099ca81;
            }
          }
LAB_0099ca81:
        }
        vH_1[0] = pvHLoad[(iVar1 + -1) % iVar23][1];
        uStack_5d8 = pvHLoad[(iVar1 + -1) % iVar23][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar23) + 0x10U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 8 | uStack_5d8 >> 0x38;
          uStack_5d8 = uStack_5d8 << 8;
        }
        local_4eb = vH_1[0]._7_1_;
        local_a8 = (char)vSaturationCheckMax[1];
        cStack_a7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_a6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_a5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_a4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_a3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_a2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_a1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_a0 = (char)vSaturationCheckMin[0];
        cStack_9f = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_9e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_9d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_9c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_9b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_9a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_99 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_118 = (char)result;
        cStack_117 = (char)((ulong)result >> 8);
        cStack_116 = (char)((ulong)result >> 0x10);
        cStack_115 = (char)((ulong)result >> 0x18);
        cStack_114 = (char)((ulong)result >> 0x20);
        cStack_113 = (char)((ulong)result >> 0x28);
        cStack_112 = (char)((ulong)result >> 0x30);
        cStack_111 = (char)((ulong)result >> 0x38);
        cStack_110 = (char)vSaturationCheckMax[0];
        cStack_10f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_10e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_10d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_10c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_10b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_10a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_109 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar37 = CONCAT17(-(cStack_99 < cVar21),
                          CONCAT16(-(cStack_9a < cVar21),
                                   CONCAT15(-(cStack_9b < cVar21),
                                            CONCAT14(-(cStack_9c < cVar21),
                                                     CONCAT13(-(cStack_9d < cVar21),
                                                              CONCAT12(-(cStack_9e < cVar21),
                                                                       CONCAT11(-(cStack_9f < cVar21
                                                                                 ),-(cStack_a0 <
                                                                                    cVar21)))))))) |
                 CONCAT17(-(cVar22 < cStack_109),
                          CONCAT16(-(cVar22 < cStack_10a),
                                   CONCAT15(-(cVar22 < cStack_10b),
                                            CONCAT14(-(cVar22 < cStack_10c),
                                                     CONCAT13(-(cVar22 < cStack_10d),
                                                              CONCAT12(-(cVar22 < cStack_10e),
                                                                       CONCAT11(-(cVar22 < 
                                                  cStack_10f),-(cVar22 < cStack_110))))))));
        auVar17._8_8_ = uVar37;
        auVar17._0_8_ =
             CONCAT17(-(cStack_a1 < cVar21),
                      CONCAT16(-(cStack_a2 < cVar21),
                               CONCAT15(-(cStack_a3 < cVar21),
                                        CONCAT14(-(cStack_a4 < cVar21),
                                                 CONCAT13(-(cStack_a5 < cVar21),
                                                          CONCAT12(-(cStack_a6 < cVar21),
                                                                   CONCAT11(-(cStack_a7 < cVar21),
                                                                            -(local_a8 < cVar21)))))
                                       ))) |
             CONCAT17(-(cVar22 < cStack_111),
                      CONCAT16(-(cVar22 < cStack_112),
                               CONCAT15(-(cVar22 < cStack_113),
                                        CONCAT14(-(cVar22 < cStack_114),
                                                 CONCAT13(-(cVar22 < cStack_115),
                                                          CONCAT12(-(cVar22 < cStack_116),
                                                                   CONCAT11(-(cVar22 < cStack_117),
                                                                            -(cVar22 < local_118))))
                                                ))));
        if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar37 >> 7 & 1) != 0) || (uVar37 >> 0xf & 1) != 0) || (uVar37 >> 0x17 & 1) != 0)
               || (uVar37 >> 0x1f & 1) != 0) || (uVar37 >> 0x27 & 1) != 0) ||
             (uVar37 >> 0x2f & 1) != 0) || (uVar37 >> 0x37 & 1) != 0) || (long)uVar37 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_4eb = '\0';
          local_478 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_4eb;
        *(int *)((long)&_segNum->s1 + 4) = local_478;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}